

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sesschan.c
# Opt level: O1

_Bool sesschan_send_signal(Channel *chan,ptrlen signame)

{
  _Bool _Var1;
  int iVar2;
  int iVar3;
  
  _Var1 = ptrlen_eq_string(signame,"INT");
  iVar2 = 0x20;
  if (_Var1) {
    iVar2 = 0x11;
  }
  _Var1 = ptrlen_eq_string(signame,"TERM");
  iVar3 = 0x12;
  if (!_Var1) {
    iVar3 = iVar2;
  }
  _Var1 = ptrlen_eq_string(signame,"KILL");
  iVar2 = 0x13;
  if (!_Var1) {
    iVar2 = iVar3;
  }
  _Var1 = ptrlen_eq_string(signame,"QUIT");
  iVar3 = 0x14;
  if (!_Var1) {
    iVar3 = iVar2;
  }
  _Var1 = ptrlen_eq_string(signame,"HUP");
  iVar2 = 0x15;
  if (!_Var1) {
    iVar2 = iVar3;
  }
  _Var1 = ptrlen_eq_string(signame,"ABRT");
  iVar3 = 0x16;
  if (!_Var1) {
    iVar3 = iVar2;
  }
  _Var1 = ptrlen_eq_string(signame,"ALRM");
  iVar2 = 0x17;
  if (!_Var1) {
    iVar2 = iVar3;
  }
  _Var1 = ptrlen_eq_string(signame,"FPE");
  iVar3 = 0x18;
  if (!_Var1) {
    iVar3 = iVar2;
  }
  _Var1 = ptrlen_eq_string(signame,"ILL");
  iVar2 = 0x19;
  if (!_Var1) {
    iVar2 = iVar3;
  }
  _Var1 = ptrlen_eq_string(signame,"PIPE");
  iVar3 = 0x1a;
  if (!_Var1) {
    iVar3 = iVar2;
  }
  _Var1 = ptrlen_eq_string(signame,"SEGV");
  iVar2 = 0x1b;
  if (!_Var1) {
    iVar2 = iVar3;
  }
  _Var1 = ptrlen_eq_string(signame,"USR1");
  iVar3 = 0x1c;
  if (!_Var1) {
    iVar3 = iVar2;
  }
  _Var1 = ptrlen_eq_string(signame,"USR2");
  iVar2 = 0x1d;
  if (!_Var1) {
    iVar2 = iVar3;
  }
  if (iVar2 != 0x20) {
    (**(code **)(**(long **)&chan[-5].initial_fixed_window_size + 0x30))
              (*(long **)&chan[-5].initial_fixed_window_size,iVar2,0);
  }
  return iVar2 != 0x20;
}

Assistant:

bool sesschan_send_signal(Channel *chan, ptrlen signame)
{
    sesschan *sess = container_of(chan, sesschan, chan);

    /* Start with a code that definitely isn't a signal (or indeed a
     * special command at all), to indicate 'nothing matched'. */
    SessionSpecialCode code = SS_EXITMENU;

    #define SIGNAL_SUB(name) \
        if (ptrlen_eq_string(signame, #name)) code = SS_SIG ## name;
    #define SIGNAL_MAIN(name, text) SIGNAL_SUB(name)
    #include "signal-list.h"
    #undef SIGNAL_MAIN
    #undef SIGNAL_SUB

    if (code == SS_EXITMENU)
        return false;

    backend_special(sess->backend, code, 0);
    return true;
}